

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBarrelShape.cpp
# Opt level: O1

cbtVector3 __thiscall
cbtBarrelShape::localGetSupportingVertexWithoutMargin(cbtBarrelShape *this,cbtVector3 *vec0)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  cbtVector3 cVar14;
  
  fVar8 = vec0->m_floats[1];
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(vec0->m_floats[0] * vec0->m_floats[0])),
                            ZEXT416((uint)vec0->m_floats[2]),ZEXT416((uint)vec0->m_floats[2]));
  if (auVar12._0_4_ < 0.0) {
    fVar9 = sqrtf(auVar12._0_4_);
  }
  else {
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    fVar9 = auVar12._0_4_;
  }
  fVar1 = vec0->m_floats[0];
  fVar2 = vec0->m_floats[2];
  fVar6 = atanf((fVar8 * this->R_vert) / (fVar9 * this->R_hor));
  fVar8 = this->R_vert;
  fVar7 = sinf(fVar6);
  fVar7 = fVar7 * fVar8;
  fVar8 = this->R_hor;
  fVar6 = cosf(fVar6);
  fVar8 = fVar6 * fVar8 + this->R_offset;
  fVar1 = fVar8 * (fVar1 / fVar9);
  fVar8 = fVar8 * (fVar2 / fVar9);
  uVar10 = SUB128(ZEXT812(0),4);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),ZEXT416((uint)fVar1),ZEXT416((uint)fVar1)
                           );
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
  if (auVar12._0_4_ < 0.0) {
    sqrtf(auVar12._0_4_);
    uVar10 = SUB128(ZEXT812(0),4);
  }
  auVar12 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar7),0x10);
  auVar4._4_8_ = uVar10;
  auVar4._0_4_ = fVar8;
  uVar11 = auVar4._0_8_;
  fVar8 = this->Y_high;
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx512vl(ZEXT416((uint)fVar8),auVar5);
  if ((auVar5._0_4_ < this->R_vert) && (fVar8 < fVar7)) {
    fVar1 = this->R_hor;
    fVar8 = fVar8 / this->R_vert;
    fVar8 = 1.0 - fVar8 * fVar8;
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
    }
    else {
      auVar12 = vsqrtss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
      fVar8 = auVar12._0_4_;
    }
    fVar8 = fVar9 / (fVar1 * fVar8 + this->R_offset);
    auVar12._0_4_ = vec0->m_floats[0] / fVar8;
    auVar12._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)this->Y_high),0x10);
    uVar11 = (ulong)(uint)(vec0->m_floats[2] / fVar8);
  }
  uVar10 = auVar12._0_8_;
  fVar8 = *(float *)&(this->super_cbtConvexInternalShape).field_0x44;
  auVar3._8_4_ = 0x7fffffff;
  auVar3._0_8_ = 0x7fffffff7fffffff;
  auVar3._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx512vl(ZEXT416((uint)fVar8),auVar3);
  if ((auVar5._0_4_ < this->R_vert) && (auVar12 = vmovshdup_avx(auVar12), auVar12._0_4_ < fVar8)) {
    fVar1 = this->R_hor;
    fVar8 = fVar8 / this->R_vert;
    fVar8 = 1.0 - fVar8 * fVar8;
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
    }
    else {
      auVar12 = vsqrtss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
      fVar8 = auVar12._0_4_;
    }
    fVar9 = fVar9 / (fVar1 * fVar8 + this->R_offset);
    auVar13._0_4_ = vec0->m_floats[0] / fVar9;
    auVar13._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar12 = vinsertps_avx(auVar13,ZEXT416(*(uint *)&(this->super_cbtConvexInternalShape).
                                                      field_0x44),0x10);
    uVar10 = auVar12._0_8_;
    uVar11 = (ulong)(uint)(vec0->m_floats[2] / fVar9);
  }
  cVar14.m_floats[2] = (cbtScalar)(int)uVar11;
  cVar14.m_floats[3] = (cbtScalar)(int)(uVar11 >> 0x20);
  cVar14.m_floats[0] = (cbtScalar)(int)uVar10;
  cVar14.m_floats[1] = (cbtScalar)(int)((ulong)uVar10 >> 0x20);
  return (cbtVector3)cVar14.m_floats;
}

Assistant:

cbtVector3	cbtBarrelShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec0)const
{
	cbtVector3 supVec(0,0,0);
	cbtVector3 supVecD;

	// suppport point on the lathed ellipse?
	cbtScalar pY = vec0.y();
	cbtScalar pR = std::sqrt(vec0.z()*vec0.z() + vec0.x()*vec0.x());
	cbtScalar pH = pR;
	cbtScalar dX = vec0.x()/pR;
	cbtScalar dZ = vec0.z()/pR;
	cbtScalar tpar = std::atan((pY*R_vert)/(pH*R_hor));
	cbtScalar sY = R_vert * std::sin(tpar);
	cbtScalar sH = R_hor  * std::cos(tpar);
	cbtScalar sR = sH + R_offset;
	cbtScalar sX = dX * sR;
	cbtScalar sZ = dZ * sR;
	supVec.setValue(sX,sY,sZ);
	cbtScalar len = supVec.length();

	// support point on the top disc?
    if ((std::abs(Y_high) < R_vert) && (supVec.y() > Y_high)) {
        cbtScalar R_high_ellips = R_hor * std::sqrt(cbtScalar(1) - std::pow(Y_high / R_vert, cbtScalar(2)));
        cbtScalar R_high = R_high_ellips + R_offset;
        cbtScalar rad_ratio = pR / R_high;
        supVecD.setValue(vec0.x() / rad_ratio, Y_high, vec0.z() / rad_ratio);
        supVec = supVecD;
    }
    // support point on the bottom disc?
    if ((std::abs(Y_low) < R_vert) && (supVec.y() < Y_low)) {
        cbtScalar R_low_ellips = R_hor * std::sqrt(cbtScalar(1) - std::pow(Y_low / R_vert, cbtScalar(2)));
        cbtScalar R_low = R_low_ellips + R_offset;
        cbtScalar rad_ratio = pR / R_low;
        supVecD.setValue(vec0.x() / rad_ratio, Y_low, vec0.z() / rad_ratio);
        supVec = supVecD;
    }

	return supVec;
}